

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

string * __thiscall
pbrt::RandomSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,RandomSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<int_const&,int_const&,pbrt::RNG_const&>
            (__return_storage_ptr__,"[ RandomSampler samplesPerPixel: %d seed: %d rng: %s ]",
             &this->samplesPerPixel,&this->seed,&this->rng);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomSampler::ToString() const {
    return StringPrintf("[ RandomSampler samplesPerPixel: %d seed: %d rng: %s ]",
                        samplesPerPixel, seed, rng);
}